

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O3

void prof_bandage(CHAR_DATA *ch,char *argument)

{
  PC_DATA *pPVar1;
  bool bVar2;
  ushort uVar3;
  short sVar4;
  CHAR_DATA *arg2;
  AFFECT_DATA *pAVar5;
  CHAR_DATA *arg2_00;
  char *pcVar6;
  CProficiencies *pCVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  string_view fmt;
  
  if (ch == (CHAR_DATA *)0x0) {
    fmt._M_str = "prof_bandage: ch is nullptr";
    fmt._M_len = 0x1b;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt);
    return;
  }
  if (argument == (char *)0x0) {
    pcVar6 = "self";
  }
  else {
    pcVar6 = "self";
    if (*argument != '\0') {
      pcVar6 = argument;
    }
  }
  arg2 = get_char_room(ch,pcVar6);
  if (arg2 == (CHAR_DATA *)0x0) {
    pcVar6 = "They aren\'t here.\n\r";
  }
  else {
    pAVar5 = affect_find(arg2->affected,(int)gsn_bleeding);
    if (pAVar5 == (AFFECT_DATA *)0x0) {
      pcVar6 = "You can only bandage wounds that are bleeding.\n\r";
    }
    else {
      bVar2 = is_affected_prof(ch,"bandage");
      if (!bVar2) {
        add_prof_affect(ch,"bandage",2,false);
        if (arg2 == ch) {
          send_to_char("You bandage your wounds, staunching the worst of the bleeding.\n\r",ch);
          pcVar6 = "$n bandages $s wounds, staunching the worst of $s bleeding.";
          arg2_00 = (CHAR_DATA *)0x0;
        }
        else {
          act("You bandage $N\'s wounds, staunching the worst of $S bleeding.",ch,(void *)0x0,arg2,3
             );
          act("$n bandages your wounds, staunching the worst of the bleeding.",ch,(void *)0x0,arg2,2
             );
          pcVar6 = "$n bandages $N\'s wounds, staunching the worst of $S bleeding.";
          arg2_00 = arg2;
        }
        act(pcVar6,ch,(void *)0x0,arg2_00,(uint)(arg2 != ch));
        pPVar1 = ch->pcdata;
        uVar3 = CProficiencies::ProfIndexLookup("bandaging");
        if (uVar3 < 0x19) {
          if (pPVar1 == (PC_DATA *)0x0) {
            pCVar7 = &prof_none;
          }
          else {
            pCVar7 = &pPVar1->profs;
          }
          dVar9 = (double)pCVar7->profs[uVar3] * 0.4;
        }
        else {
          dVar9 = -0.4;
        }
        dVar10 = 1.0;
        if (1.0 <= dVar9) {
          dVar10 = dVar9;
        }
        fVar8 = (float)((double)arg2->hit + (double)(int)arg2->level * dVar10);
        if ((float)(int)arg2->max_hit <= fVar8) {
          fVar8 = (float)(int)arg2->max_hit;
        }
        arg2->hit = (int)fVar8;
        if (ch->pcdata == (PC_DATA *)0x0) {
          pCVar7 = &prof_none;
        }
        else {
          pCVar7 = &ch->pcdata->profs;
        }
        sVar4 = CProficiencies::ProfIndexLookup("bandaging");
        CProficiencies::CheckImprove(pCVar7,(int)sVar4,1000);
        WAIT_STATE(ch,0xc);
        return;
      }
      pcVar6 = "That wound has been bandaged too recently.\n\r";
    }
  }
  send_to_char(pcVar6,ch);
  return;
}

Assistant:

void prof_bandage(CHAR_DATA *ch, char *argument)
{
	if (ch == nullptr)
	{
		RS.Logger.Debug("prof_bandage: ch is nullptr");
		return;
	}

	auto victim = argument == nullptr || argument[0] == '\0'
		? get_char_room(ch, "self")
		: get_char_room(ch, argument);

	if (!victim)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	auto baf = affect_find(victim->affected, gsn_bleeding);
	if (!baf)
	{
		send_to_char("You can only bandage wounds that are bleeding.\n\r", ch);
		return;
	}

	if (is_affected_prof(ch, "bandage"))
	{
		send_to_char("That wound has been bandaged too recently.\n\r", ch);
		return;
	}

	//if(baf->level)
	//	baf->level /= 2;

	add_prof_affect(ch, "bandage", 2, false);

	if (victim == ch)
	{
		send_to_char("You bandage your wounds, staunching the worst of the bleeding.\n\r", ch);
		act("$n bandages $s wounds, staunching the worst of $s bleeding.", ch, 0, 0, TO_ROOM);
	}
	else
	{
		act("You bandage $N's wounds, staunching the worst of $S bleeding.", ch, 0, victim, TO_CHAR);
		act("$n bandages your wounds, staunching the worst of the bleeding.", ch, 0, victim, TO_VICT);
		act("$n bandages $N's wounds, staunching the worst of $S bleeding.", ch, 0, victim, TO_NOTVICT);
	}

	float hadd = (std::max(ch->Profs()->GetProf("bandaging") * 0.4, (double)1) * victim->level) + victim->hit;
	victim->hit = std::min((float)victim->max_hit, hadd);
	ch->Profs()->CheckImprove("bandaging", 1000);

	WAIT_STATE(ch, PULSE_VIOLENCE);
}